

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_addv_b_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  cVar4 = *(char *)((long)pfVar1 + 1);
  cVar5 = *(char *)((long)pfVar1 + 2);
  cVar6 = *(char *)((long)pfVar1 + 3);
  cVar7 = *(char *)((long)pfVar1 + 4);
  cVar8 = *(char *)((long)pfVar1 + 5);
  cVar9 = *(char *)((long)pfVar1 + 6);
  cVar10 = *(char *)((long)pfVar1 + 7);
  cVar11 = *(char *)((long)pfVar1 + 8);
  cVar12 = *(char *)((long)pfVar1 + 9);
  cVar13 = *(char *)((long)pfVar1 + 10);
  cVar14 = *(char *)((long)pfVar1 + 0xb);
  cVar15 = *(char *)((long)pfVar1 + 0xc);
  cVar16 = *(char *)((long)pfVar1 + 0xd);
  cVar17 = *(char *)((long)pfVar1 + 0xe);
  cVar18 = *(char *)((long)pfVar1 + 0xf);
  pfVar2 = (env->active_fpu).fpr + wt;
  cVar19 = *(char *)((long)pfVar2 + 1);
  cVar20 = *(char *)((long)pfVar2 + 2);
  cVar21 = *(char *)((long)pfVar2 + 3);
  cVar22 = *(char *)((long)pfVar2 + 4);
  cVar23 = *(char *)((long)pfVar2 + 5);
  cVar24 = *(char *)((long)pfVar2 + 6);
  cVar25 = *(char *)((long)pfVar2 + 7);
  cVar26 = *(char *)((long)pfVar2 + 8);
  cVar27 = *(char *)((long)pfVar2 + 9);
  cVar28 = *(char *)((long)pfVar2 + 10);
  cVar29 = *(char *)((long)pfVar2 + 0xb);
  cVar30 = *(char *)((long)pfVar2 + 0xc);
  cVar31 = *(char *)((long)pfVar2 + 0xd);
  cVar32 = *(char *)((long)pfVar2 + 0xe);
  cVar33 = *(char *)((long)pfVar2 + 0xf);
  pfVar3 = (env->active_fpu).fpr + wd;
  *(char *)pfVar3 = *(char *)pfVar2 + *(char *)pfVar1;
  *(char *)((long)pfVar3 + 1) = cVar19 + cVar4;
  *(char *)((long)pfVar3 + 2) = cVar20 + cVar5;
  *(char *)((long)pfVar3 + 3) = cVar21 + cVar6;
  *(char *)((long)pfVar3 + 4) = cVar22 + cVar7;
  *(char *)((long)pfVar3 + 5) = cVar23 + cVar8;
  *(char *)((long)pfVar3 + 6) = cVar24 + cVar9;
  *(char *)((long)pfVar3 + 7) = cVar25 + cVar10;
  *(char *)((long)pfVar3 + 8) = cVar26 + cVar11;
  *(char *)((long)pfVar3 + 9) = cVar27 + cVar12;
  *(char *)((long)pfVar3 + 10) = cVar28 + cVar13;
  *(char *)((long)pfVar3 + 0xb) = cVar29 + cVar14;
  *(char *)((long)pfVar3 + 0xc) = cVar30 + cVar15;
  *(char *)((long)pfVar3 + 0xd) = cVar31 + cVar16;
  *(char *)((long)pfVar3 + 0xe) = cVar32 + cVar17;
  *(char *)((long)pfVar3 + 0xf) = cVar33 + cVar18;
  return;
}

Assistant:

void helper_msa_addv_b(CPUMIPSState *env,
                       uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_addv_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_addv_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_addv_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_addv_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_addv_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_addv_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_addv_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_addv_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_addv_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_addv_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_addv_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_addv_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_addv_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_addv_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_addv_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_addv_df(DF_BYTE, pws->b[15], pwt->b[15]);
}